

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btKinematicCharacterController.cpp
# Opt level: O1

void __thiscall
btKinematicCharacterController::preStep
          (btKinematicCharacterController *this,btCollisionWorld *collisionWorld)

{
  undefined8 uVar1;
  undefined8 uVar2;
  btPairCachingGhostObject *pbVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  int iVar6;
  
  this->m_touchingContact = false;
  uVar1 = *(undefined8 *)((this->m_platformLinearVelocity).m_floats + 2);
  *(undefined8 *)(this->m_newPlatformLinearVelocity).m_floats =
       *(undefined8 *)(this->m_platformLinearVelocity).m_floats;
  *(undefined8 *)((this->m_newPlatformLinearVelocity).m_floats + 2) = uVar1;
  iVar6 = 5;
  do {
    bVar5 = recoverFromPenetration(this,collisionWorld);
    if (!bVar5) break;
    this->m_touchingContact = true;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  uVar1 = *(undefined8 *)(this->m_platformLinearVelocity).m_floats;
  uVar2 = *(undefined8 *)(this->m_newPlatformLinearVelocity).m_floats;
  auVar4._4_4_ = (float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20) * 0.0;
  auVar4._0_4_ = (float)uVar2 + (float)uVar1 * 0.0;
  auVar4._8_4_ = (this->m_platformLinearVelocity).m_floats[2] * 0.0 +
                 (this->m_newPlatformLinearVelocity).m_floats[2];
  auVar4._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_platformLinearVelocity).m_floats = auVar4;
  pbVar3 = this->m_ghostObject;
  uVar1 = *(undefined8 *)
           ((pbVar3->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_origin.m_floats
           + 2);
  *(undefined8 *)(this->m_currentPosition).m_floats =
       *(undefined8 *)
        (pbVar3->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_origin.m_floats;
  *(undefined8 *)((this->m_currentPosition).m_floats + 2) = uVar1;
  uVar1 = *(undefined8 *)
           ((pbVar3->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_origin.m_floats
           + 2);
  *(undefined8 *)(this->m_targetPosition).m_floats =
       *(undefined8 *)
        (pbVar3->super_btGhostObject).super_btCollisionObject.m_worldTransform.m_origin.m_floats;
  *(undefined8 *)((this->m_targetPosition).m_floats + 2) = uVar1;
  return;
}

Assistant:

void btKinematicCharacterController::preStep (  btCollisionWorld* collisionWorld)
{

	int numPenetrationLoops = 0;
	m_touchingContact = false;
	m_newPlatformLinearVelocity = m_platformLinearVelocity;

	while (recoverFromPenetration (collisionWorld))
	{
		numPenetrationLoops++;
		m_touchingContact = true;
		if (numPenetrationLoops > 4)
		{
			//printf("character could not recover from penetration = %d\n", numPenetrationLoops);
			break;
		}
	}

	auto platformVelocityResponseAlpha = 1.0;
	m_platformLinearVelocity = m_platformLinearVelocity*(1.0f - platformVelocityResponseAlpha) + m_newPlatformLinearVelocity*platformVelocityResponseAlpha;

	m_currentPosition = m_ghostObject->getWorldTransform().getOrigin();
	m_targetPosition = m_currentPosition;
//	printf("m_targetPosition=%f,%f,%f\n",m_targetPosition[0],m_targetPosition[1],m_targetPosition[2]);


}